

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

int dotele(void)

{
  bool bVar1;
  char cVar2;
  schar sVar3;
  boolean bVar4;
  int iVar5;
  char *pcVar6;
  int local_24;
  int local_20;
  int energy;
  int sp_no;
  boolean castit;
  trap *trap;
  
  _sp_no = t_at(level,(int)u.ux,(int)u.uy);
  if ((_sp_no != (trap *)0x0) &&
     ((((byte)_sp_no->field_0x8 >> 5 & 1) == 0 || ((_sp_no->field_0x8 & 0x1f) != 0x10)))) {
    _sp_no = (trap *)0x0;
  }
  if (_sp_no != (trap *)0x0) {
    if (((byte)_sp_no->field_0x8 >> 6 & 1) != 0) {
      pline("This is a vault teleport, usable once only.");
      cVar2 = yn_function("Jump in?","yn",'n');
      if (cVar2 == 'n') {
        _sp_no = (trap *)0x0;
      }
      else {
        deltrap(level,_sp_no);
        newsym((int)u.ux,(int)u.uy);
      }
    }
    if (_sp_no != (trap *)0x0) {
      pcVar6 = locomotion(youmonst.data,"jump");
      pline("You %s onto the teleportation trap.",pcVar6);
    }
  }
  if (_sp_no != (trap *)0x0) goto LAB_002f89de;
  bVar1 = false;
  local_20 = 0;
  if (((u.uprops[0xe].intrinsic == 0) && (u.uprops[0xe].extrinsic == 0)) &&
     (((youmonst.data)->mflags1 & 0x2000000) == 0)) {
LAB_002f8783:
    if (((objects[0x19f].field_0x10 & 1) != 0) && (u.uprops[0x1c].intrinsic == 0)) {
      for (local_20 = 0; local_20 < 0x2b; local_20 = local_20 + 1) {
        if (spl_book[local_20].sp_id == 0x19f) {
          bVar1 = true;
          break;
        }
      }
    }
    if ((flags.debug == '\0') && (!bVar1)) {
      if ((u.uprops[0xe].intrinsic == 0) &&
         ((u.uprops[0xe].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x2000000) == 0)))) {
        pline("You don\'t know that spell.");
      }
      else {
        pline("You are not able to teleport at will.");
      }
      return 0;
    }
  }
  else {
    iVar5 = 0xc;
    if (urole.malenum == 0x168) {
      iVar5 = 8;
    }
    if ((u.ulevel < iVar5) && (((youmonst.data)->mflags1 & 0x2000000) == 0)) goto LAB_002f8783;
  }
  if (((u.uhunger < 0x65) || (sVar3 = acurr(0), sVar3 < '\x06')) && (flags.debug == '\0')) {
    pcVar6 = "to teleport";
    if (bVar1) {
      pcVar6 = "for a teleport spell";
    }
    pline("You lack the strength %s.",pcVar6);
    return 1;
  }
  iVar5 = objects[0x19f].oc_oc2 * 7;
  local_24 = iVar5 / 2 + -2;
  if (u.uen <= local_24) {
    if (flags.debug == '\0') {
      pcVar6 = "to teleport";
      if (bVar1) {
        pcVar6 = "for a teleport spell";
      }
      pline("You lack the energy %s.",pcVar6,(long)iVar5 % 2 & 0xffffffff);
      return 1;
    }
    local_24 = u.uen;
  }
  bVar4 = check_capacity("Your concentration falters from carrying so much.");
  if (bVar4 != '\0') {
    return 1;
  }
  if (bVar1) {
    exercise(2,'\x01');
    iVar5 = spelleffects(local_20,'\x01');
    if (iVar5 != 0) {
      return 1;
    }
    if (flags.debug == '\0') {
      return 0;
    }
  }
  else {
    u.uen = u.uen - local_24;
    iflags.botl = '\x01';
  }
LAB_002f89de:
  bVar4 = next_to_u();
  if (bVar4 == '\0') {
    pline("You shudder for a moment.");
    trap._4_4_ = 0;
  }
  else {
    if ((_sp_no == (trap *)0x0) || (((byte)_sp_no->field_0x8 >> 6 & 1) == 0)) {
      iVar5 = tele((char *)0x0);
      if (iVar5 == 0) {
        return 0;
      }
    }
    else {
      vault_tele();
    }
    next_to_u();
    if (_sp_no == (trap *)0x0) {
      morehungry(100);
    }
    trap._4_4_ = 1;
  }
  return trap._4_4_;
}

Assistant:

int dotele(void)
{
	struct trap *trap;

	trap = t_at(level, u.ux, u.uy);
	if (trap && (!trap->tseen || trap->ttyp != TELEP_TRAP))
		trap = 0;

	if (trap) {
		if (trap->once) {
			pline("This is a vault teleport, usable once only.");
			if (yn("Jump in?") == 'n')
				trap = 0;
			else {
				deltrap(level, trap);
				newsym(u.ux, u.uy);
			}
		}
		if (trap)
			pline("You %s onto the teleportation trap.",
			    locomotion(youmonst.data, "jump"));
	}
	if (!trap) {
	    boolean castit = FALSE;
	    int sp_no = 0, energy = 0;

	    if (!Teleportation || (u.ulevel < (Role_if (PM_WIZARD) ? 8 : 12)
					&& !can_teleport(youmonst.data))) {
		/* Try to use teleport away spell. */
		if (objects[SPE_TELEPORT_AWAY].oc_name_known && !Confusion)
		    for (sp_no = 0; sp_no < MAXSPELL; sp_no++)
			if (spl_book[sp_no].sp_id == SPE_TELEPORT_AWAY) {
				castit = TRUE;
				break;
			}
		if (!wizard) {
		    if (!castit) {
			if (!Teleportation)
			    pline("You don't know that spell.");
			else pline("You are not able to teleport at will.");
			return 0;
		    }
		}
	    }

	    if (u.uhunger <= 100 || ACURR(A_STR) < 6) {
		if (!wizard) {
			pline("You lack the strength %s.",
			    castit ? "for a teleport spell" : "to teleport");
			return 1;
		}
	    }

	    energy = objects[SPE_TELEPORT_AWAY].oc_level * 7 / 2 - 2;
	    if (u.uen <= energy) {
		if (wizard)
			energy = u.uen;
		else
		{
			pline("You lack the energy %s.",
			    castit ? "for a teleport spell" : "to teleport");
			return 1;
		}
	    }

	    if (check_capacity(
			"Your concentration falters from carrying so much."))
		return 1;

	    if (castit) {
		exercise(A_WIS, TRUE);
		if (spelleffects(sp_no, TRUE))
			return 1;
		else
		    if (!wizard)
			return 0;
	    } else {
		u.uen -= energy;
		iflags.botl = 1;
	    }
	}

	if (next_to_u()) {
		if (trap && trap->once) vault_tele();
		else if (!tele(NULL)) return 0;
		next_to_u();
	} else {
		pline("You shudder for a moment.");
		return 0;
	}
	if (!trap) morehungry(100);
	return 1;
}